

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
dlib::tensor::
add_to_sample<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          (tensor *this,unsigned_long_long idx,
          matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
          *item)

{
  int iVar1;
  matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
  *pmVar2;
  ostream *poVar3;
  undefined8 uVar4;
  long lVar5;
  longlong lVar6;
  assignable_ptr_matrix<float> *this_00;
  undefined4 extraout_var;
  long lVar7;
  float *ptr;
  matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
  *in_RSI;
  tensor *in_RDI;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
  *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  error_type t;
  fatal_error *in_stack_fffffffffffffb90;
  ostringstream local_340 [383];
  undefined1 local_1c1;
  ostringstream local_190 [384];
  matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
  *local_10;
  
  t = (error_type)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  local_10 = in_RSI;
  pmVar2 = (matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
            *)num_samples(in_RDI);
  if (pmVar2 <= in_RSI) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = std::operator<<((ostream *)local_190,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xab);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_190,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_190,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::tensor::add_to_sample(unsigned long long, const matrix_exp<EXP> &) [EXP = dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_trans<dlib::matrix<float>>>>]"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_190,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"idx < (unsigned long long)num_samples()");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_190,std::boolalpha);
    poVar3 = std::operator<<(poVar3,"");
    std::operator<<(poVar3,"\n");
    local_1c1 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffffb90,t,in_stack_fffffffffffffb80);
    local_1c1 = 0;
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  lVar5 = matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
          ::size(in_stack_fffffffffffffb70);
  pmVar2 = (matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
            *)nr(in_RDI);
  lVar6 = nc(in_RDI);
  this_00 = (assignable_ptr_matrix<float> *)((long)pmVar2 * lVar6);
  lVar6 = k(in_RDI);
  if (lVar5 != (long)this_00 * lVar6) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_340);
    poVar3 = std::operator<<((ostream *)local_340,"\n\nError detected at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xac);
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_340,"Error detected in file ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
                            );
    std::operator<<(poVar3,".\n");
    poVar3 = std::operator<<((ostream *)local_340,"Error detected in function ");
    poVar3 = std::operator<<(poVar3,
                             "void dlib::tensor::add_to_sample(unsigned long long, const matrix_exp<EXP> &) [EXP = dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_trans<dlib::matrix<float>>>>]"
                            );
    std::operator<<(poVar3,".\n\n");
    poVar3 = std::operator<<((ostream *)local_340,"Failing expression was ");
    poVar3 = std::operator<<(poVar3,"item.size() == nr()*nc()*k()");
    std::operator<<(poVar3,".\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_340,std::boolalpha);
    poVar3 = std::operator<<(poVar3,"");
    std::operator<<(poVar3,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffffb90,t,in_stack_fffffffffffffb80);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  iVar1 = (*in_RDI->_vptr_tensor[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  lVar7 = matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
          ::size(local_10);
  ptr = (float *)(lVar5 + (long)local_10 * lVar7 * 4);
  matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
  ::nr((matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
        *)0x25e157);
  matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
  ::nc((matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
        *)0x25e169);
  set_ptrm<float>(ptr,lVar5,(long)local_10);
  assignable_ptr_matrix<float>::operator+=(this_00,pmVar2);
  return;
}

Assistant:

void add_to_sample (
            unsigned long long idx,
            const matrix_exp<EXP>& item
        )
        {
            DLIB_CASSERT(idx < (unsigned long long)num_samples());
            DLIB_CASSERT(item.size() == nr()*nc()*k());
            static_assert((is_same_type<float, typename EXP::type>::value == true),
                "To assign a matrix to a tensor the matrix must contain float values");
            set_ptrm(host()+idx*item.size(), item.nr(), item.nc()) += item;
        }